

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5StorageClose(Fts5Storage *p)

{
  int in_EAX;
  int extraout_EAX;
  long lVar1;
  
  if (p != (Fts5Storage *)0x0) {
    lVar1 = 6;
    do {
      sqlite3_finalize(p->aStmt[lVar1 + -6]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x12);
    sqlite3_free(p);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int sqlite3Fts5StorageClose(Fts5Storage *p){
  int rc = SQLITE_OK;
  if( p ){
    int i;

    /* Finalize all SQL statements */
    for(i=0; i<ArraySize(p->aStmt); i++){
      sqlite3_finalize(p->aStmt[i]);
    }

    sqlite3_free(p);
  }
  return rc;
}